

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

void __thiscall
spvtools::opt::Function::ForEachParam
          (Function *this,function<void_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  char cVar3;
  undefined7 in_register_00000011;
  pointer puVar4;
  Instruction *dbg_line;
  Instruction *pIVar5;
  bool bVar6;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_78;
  undefined4 local_6c;
  function<void_(spvtools::opt::Instruction_*)> *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  pointer local_40;
  function<void_(spvtools::opt::Instruction_*)> *local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000011,run_on_debug_line_insts);
  puVar4 = (this->params_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (this->params_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != local_40) {
    local_38 = f;
    do {
      pIVar1 = (puVar4->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uStack_60 = 0;
      local_68 = local_38;
      pcStack_50 = std::
                   _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:780:7)>
                 ::_M_manager;
      if ((char)local_6c != '\0') {
        pIVar5 = *(Instruction **)
                  &(pIVar1->dbg_line_insts_).
                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                   ._M_impl;
        pIVar2 = *(pointer *)
                  ((long)&(pIVar1->dbg_line_insts_).
                          super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                  + 8);
        if (pIVar5 != pIVar2) {
          bVar6 = false;
          do {
            local_78._M_head_impl = pIVar5;
            if (local_58 == (code *)0x0) goto LAB_00583de8;
            cVar3 = (*pcStack_50)(&local_68,&local_78);
            if (cVar3 == '\0') {
              if (!bVar6) goto LAB_00583db3;
              break;
            }
            pIVar5 = pIVar5 + 1;
            bVar6 = pIVar5 == pIVar2;
          } while (!bVar6);
        }
      }
      local_78._M_head_impl = pIVar1;
      if (local_58 == (code *)0x0) {
LAB_00583de8:
        std::__throw_bad_function_call();
      }
      (*pcStack_50)(&local_68,&local_78);
LAB_00583db3:
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != local_40);
  }
  return;
}

Assistant:

void Function::ForEachParam(const std::function<void(Instruction*)>& f,
                            bool run_on_debug_line_insts) {
  for (auto& param : params_)
    static_cast<Instruction*>(param.get())
        ->ForEachInst(f, run_on_debug_line_insts);
}